

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_test.cpp
# Opt level: O0

void __thiscall
SpinMutexTest_TryLock_Test<yamc::spin_ttas::basic_mutex<yamc::backoff::exponential<4000U>_>_>::
TestBody(SpinMutexTest_TryLock_Test<yamc::spin_ttas::basic_mutex<yamc::backoff::exponential<4000U>_>_>
         *this)

{
  bool bVar1;
  char *message;
  size_t *in_RCX;
  anon_class_16_2_e823ffd4_for_f f;
  AssertHelper local_68 [3];
  Message local_50;
  uint local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  unsigned_long local_20;
  size_t counter;
  SpinMutexTest_TryLock_Test<yamc::spin_ttas::basic_mutex<yamc::backoff::exponential<4000U>_>_>
  *pSStack_10;
  TypeParam mtx;
  SpinMutexTest_TryLock_Test<yamc::spin_ttas::basic_mutex<yamc::backoff::exponential<4000U>_>_>
  *this_local;
  
  pSStack_10 = this;
  yamc::spin_ttas::basic_mutex<yamc::backoff::exponential<4000U>_>::basic_mutex
            ((basic_mutex<yamc::backoff::exponential<4000U>_> *)((long)&counter + 4));
  local_20 = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)&counter + 4);
  f.counter = in_RCX;
  f.mtx = (TypeParam *)&local_20;
  yamc::test::
  task_runner<SpinMutexTest_TryLock_Test<yamc::spin_ttas::basic_mutex<yamc::backoff::exponential<4000u>>>::TestBody()::_lambda(unsigned_long)_1_>
            ((test *)0x14,
             (size_t)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,f);
  local_44 = 2000000;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_40,"100000u * 20","counter",&local_44,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/spinlock_test.cpp"
               ,0x47,message);
    testing::internal::AssertHelper::operator=(local_68,&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

TYPED_TEST(SpinMutexTest, TryLock)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock()) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}